

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O3

int duckdb_brotli::BrotliEncoderCompress
              (int quality,int lgwin,BrotliEncoderMode mode,size_t input_size,uint8_t *input_buffer,
              size_t *encoded_size,uint8_t *encoded_buffer)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  BrotliEncoderStateInternal *s;
  uint uVar4;
  long lVar5;
  size_t __n;
  ulong uVar6;
  long lVar7;
  size_t size;
  size_t total_out;
  uint8_t *next_out;
  size_t available_out;
  uint8_t *next_in;
  size_t available_in;
  size_t local_60;
  size_t local_58;
  uint8_t *local_50;
  size_t local_48;
  uint8_t *local_40;
  size_t local_38;
  
  local_58 = *encoded_size;
  if (input_size == 0) {
    if (local_58 == 0) {
      return 0;
    }
    *encoded_size = 1;
    *encoded_buffer = '\x06';
  }
  else {
    uVar3 = input_size + (input_size >> 0xe) * 4 + 6;
    uVar6 = 0;
    if (input_size <= uVar3) {
      uVar6 = uVar3;
    }
    if (local_58 == 0) {
      return 0;
    }
    s = BrotliEncoderCreateInstance((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
    if (s == (BrotliEncoderStateInternal *)0x0) {
      return 0;
    }
    local_48 = *encoded_size;
    local_50 = encoded_buffer;
    local_60 = 0;
    if (s->is_initialized_ == 0) {
      (s->params).quality = quality;
      (s->params).lgwin = lgwin;
      (s->params).mode = mode;
      (s->params).size_hint = input_size & 0xffffffff;
      if (0x18 < lgwin) {
        (s->params).large_window = 1;
      }
    }
    local_40 = input_buffer;
    local_38 = input_size;
    iVar1 = BrotliEncoderCompressStream
                      (s,BROTLI_OPERATION_FINISH,&local_38,&local_40,&local_48,&local_50,&local_60);
    if ((s->stream_state_ != BROTLI_STREAM_FINISHED) || (s->available_out_ != 0)) {
      iVar1 = 0;
    }
    *encoded_size = local_60;
    BrotliEncoderDestroyInstance(s);
    if ((iVar1 == 0) || ((uVar6 != 0 && (uVar6 < *encoded_size)))) {
      *encoded_size = 0;
      if (local_58 <= uVar6 - 1) {
        return 0;
      }
      encoded_buffer[0] = '!';
      encoded_buffer[1] = '\x03';
      lVar5 = 2;
      lVar7 = 0;
      do {
        __n = 0x1000000;
        if (input_size < 0x1000000) {
          __n = input_size;
        }
        iVar1 = 2 - (uint)(input_size < 0x100001);
        if (input_size < 0x10001) {
          iVar1 = 0;
        }
        uVar4 = ((int)__n * 8 + iVar1 * 2) - 8;
        uVar2 = 0x80000 << ((byte)(iVar1 << 2) & 0x1f) | uVar4;
        encoded_buffer[lVar5] = (uint8_t)uVar4;
        encoded_buffer[lVar5 + 1] = (uint8_t)((uint)((int)__n * 8 + -8) >> 8);
        encoded_buffer[lVar5 + 2] = (uint8_t)(uVar2 >> 0x10);
        if (input_size < 0x100001) {
          lVar5 = lVar5 + 3;
        }
        else {
          encoded_buffer[lVar5 + 3] = (uint8_t)(uVar2 >> 0x18);
          lVar5 = lVar5 + 4;
        }
        switchD_0033274c::default(encoded_buffer + lVar5,input_buffer + lVar7,__n);
        lVar5 = lVar5 + __n;
        lVar7 = lVar7 + __n;
        input_size = input_size - __n;
      } while (input_size != 0);
      encoded_buffer[lVar5] = '\x03';
      *encoded_size = lVar5 + 1;
    }
  }
  return 1;
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliEncoderCompress(
    int quality, int lgwin, BrotliEncoderMode mode, size_t input_size,
    const uint8_t input_buffer[BROTLI_ARRAY_PARAM(input_size)],
    size_t* encoded_size,
    uint8_t encoded_buffer[BROTLI_ARRAY_PARAM(*encoded_size)]) {
  BrotliEncoderState* s;
  size_t out_size = *encoded_size;
  const uint8_t* input_start = input_buffer;
  uint8_t* output_start = encoded_buffer;
  size_t max_out_size = BrotliEncoderMaxCompressedSize(input_size);
  if (out_size == 0) {
    /* Output buffer needs at least one byte. */
    return BROTLI_FALSE;
  }
  if (input_size == 0) {
    /* Handle the special case of empty input. */
    *encoded_size = 1;
    *encoded_buffer = 6;
    return BROTLI_TRUE;
  }

  s = BrotliEncoderCreateInstance(0, 0, 0);
  if (!s) {
    return BROTLI_FALSE;
  } else {
    size_t available_in = input_size;
    const uint8_t* next_in = input_buffer;
    size_t available_out = *encoded_size;
    uint8_t* next_out = encoded_buffer;
    size_t total_out = 0;
    BROTLI_BOOL result = BROTLI_FALSE;
    /* TODO(eustas): check that parameters are sane. */
    BrotliEncoderSetParameter(s, BROTLI_PARAM_QUALITY, (uint32_t)quality);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_LGWIN, (uint32_t)lgwin);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_MODE, (uint32_t)mode);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_SIZE_HINT, (uint32_t)input_size);
    if (lgwin > BROTLI_MAX_WINDOW_BITS) {
      BrotliEncoderSetParameter(s, BROTLI_PARAM_LARGE_WINDOW, BROTLI_TRUE);
    }
    result = BrotliEncoderCompressStream(s, BROTLI_OPERATION_FINISH,
        &available_in, &next_in, &available_out, &next_out, &total_out);
    if (!BrotliEncoderIsFinished(s)) result = 0;
    *encoded_size = total_out;
    BrotliEncoderDestroyInstance(s);
    if (!result || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }
fallback:
  *encoded_size = 0;
  if (!max_out_size) return BROTLI_FALSE;
  if (out_size >= max_out_size) {
    *encoded_size =
        MakeUncompressedStream(input_start, input_size, output_start);
    return BROTLI_TRUE;
  }
  return BROTLI_FALSE;
}